

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cVertexAttrib64BitTest.cpp
# Opt level: O1

void __thiscall
VertexAttrib64Bit::LimitTest::prepareProgram
          (LimitTest *this,_iteration iteration,bool use_arrays,bool use_locations,
          bool use_vertex_attrib_divisor,programInfo *program_info)

{
  GLuint GVar1;
  GLenum GVar2;
  string vertex_shader_code;
  string varying_name;
  GLchar *temp_varying_name;
  string local_78;
  string local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_38;
  
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  local_58._M_string_length = 0;
  local_58.field_2._M_local_buf[0] = '\0';
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  local_78._M_string_length = 0;
  local_78.field_2._M_local_buf[0] = '\0';
  GVar1 = (*(this->super_Base).gl.createProgram)();
  program_info->m_program_id = GVar1;
  GVar2 = (*(this->super_Base).gl.getError)();
  glu::checkError(GVar2,"CreateProgram",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cVertexAttrib64BitTest.cpp"
                  ,0x8f1);
  getProgramDetails(this,iteration,use_arrays,use_locations,use_vertex_attrib_divisor,&local_58,
                    &local_78);
  local_38 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_58._M_dataplus._M_p;
  (*(this->super_Base).gl.transformFeedbackVaryings)
            (program_info->m_program_id,1,(GLchar **)&local_38,0x8c8c);
  GVar2 = (*(this->super_Base).gl.getError)();
  glu::checkError(GVar2,"TransformFeedbackVaryings",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cVertexAttrib64BitTest.cpp"
                  ,0x8fb);
  Base::BuildProgram(&this->super_Base,
                     "#version 400\n#extension GL_ARB_vertex_attrib_64bit : require\n\nprecision highp float;\n\nvoid main()\n{\n    discard;\n}\n\n"
                     ,&program_info->m_program_id,local_78._M_dataplus._M_p,
                     &program_info->m_fragment_shader_id,&program_info->m_vertex_shader_id);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,
                    CONCAT71(local_78.field_2._M_allocated_capacity._1_7_,
                             local_78.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,
                    CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                             local_58.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void LimitTest::prepareProgram(_iteration iteration, bool use_arrays, bool use_locations,
							   bool use_vertex_attrib_divisor, programInfo& program_info)
{
	static const GLchar* fragment_shader_code = "#version 400\n"
												"#extension GL_ARB_vertex_attrib_64bit : require\n"
												"\n"
												"precision highp float;\n"
												"\n"
												"void main()\n"
												"{\n"
												"    discard;\n"
												"}\n\n";
	std::string varying_name;
	std::string vertex_shader_code;

	program_info.m_program_id = gl.createProgram();
	GLU_EXPECT_NO_ERROR(gl.getError(), "CreateProgram");

	getProgramDetails(iteration, use_arrays, use_locations, use_vertex_attrib_divisor, varying_name,
					  vertex_shader_code);

	{
		const GLchar* temp_varying_name = varying_name.c_str();

		gl.transformFeedbackVaryings(program_info.m_program_id, m_n_varyings, &temp_varying_name,
									 GL_INTERLEAVED_ATTRIBS);
		GLU_EXPECT_NO_ERROR(gl.getError(), "TransformFeedbackVaryings");
	}

	BuildProgram(fragment_shader_code, program_info.m_program_id, vertex_shader_code.c_str(),
				 program_info.m_fragment_shader_id, program_info.m_vertex_shader_id);
}